

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_0::InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase>::
InitializeableArray(InitializeableArray<kj::(anonymous_namespace)::HeaderTestCase> *this,
                   initializer_list<kj::(anonymous_namespace)::HeaderTestCase> init)

{
  HeaderTestCase *__dest;
  size_t capacity;
  Array<kj::(anonymous_namespace)::HeaderTestCase> result;
  
  capacity = init._M_len;
  __dest = (HeaderTestCase *)
           _::HeapArrayDisposer::allocateImpl
                     (0x20,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  if (capacity != 0) {
    memcpy(__dest,init._M_array,capacity << 5);
  }
  result.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  (this->super_Array<kj::(anonymous_namespace)::HeaderTestCase>).ptr = __dest;
  (this->super_Array<kj::(anonymous_namespace)::HeaderTestCase>).size_ = capacity;
  (this->super_Array<kj::(anonymous_namespace)::HeaderTestCase>).disposer =
       (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  result.ptr = (HeaderTestCase *)0x0;
  result.size_ = 0;
  Array<kj::(anonymous_namespace)::HeaderTestCase>::~Array(&result);
  return;
}

Assistant:

InitializeableArray(std::initializer_list<T> init)
      : Array<T>(kj::heapArray(init)) {}